

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O2

bool __thiscall ON_RevSurface::IsConical(ON_RevSurface *this,ON_Cone *cone,double tolerance)

{
  ON_3dVector *v;
  bool bVar1;
  double dVar2;
  double dVar3;
  double r [2];
  ON_Line line;
  double local_120;
  double local_118;
  double local_108;
  undefined8 uStack_100;
  double local_f8;
  double dStack_f0;
  ON_3dVector local_e8;
  ON_Cone local_d0;
  ON_Line local_40;
  
  local_118 = tolerance;
  ON_Cone::ON_Cone(&local_d0);
  ON_Line::ON_Line(&local_40);
  local_f8 = 0.0;
  dStack_f0 = 0.0;
  local_120 = 0.0;
  bVar1 = ON_IsValid(local_118);
  dVar2 = local_118;
  if (!bVar1) {
    dVar2 = 2.3283064365386963e-10;
  }
  bVar1 = ON__IsCylConeHelper(&this->m_axis,this->m_curve,
                              (double)(~-(ulong)(0.0 < local_118) & 0x3df0000000000000 |
                                      (ulong)dVar2 & -(ulong)(0.0 < local_118)),&local_d0.plane,
                              &local_40,&local_f8,&local_120);
  dVar2 = local_f8;
  if (bVar1) {
    local_118 = dStack_f0;
    dVar3 = local_f8 - dStack_f0;
    if (2.3283064365386963e-10 < ABS(dVar3)) {
      if ((local_f8 != 0.0) || (NAN(local_f8))) {
        if ((dStack_f0 != 0.0) || (NAN(dStack_f0))) {
          v = &local_d0.plane.zaxis;
          if (dVar3 <= 0.0) {
            local_108 = local_120;
            uStack_100 = 0;
            dVar3 = (local_f8 * local_120) / dVar3;
            ::operator*(&local_e8,dVar3,v);
            ON_3dPoint::operator+=((ON_3dPoint *)&local_d0,&local_e8);
            ON_Plane::UpdateEquation(&local_d0.plane);
            local_d0.radius = local_118;
            local_d0.height = local_108 - dVar3;
            goto LAB_005ae455;
          }
          local_108 = (local_f8 / dVar3) * local_120;
          uStack_100 = 0;
          ::operator*(&local_e8,local_108,v);
          ON_3dPoint::operator+=((ON_3dPoint *)&local_d0,&local_e8);
          ON_Plane::UpdateEquation(&local_d0.plane);
        }
        else {
          local_108 = local_120;
          uStack_100 = 0;
          ::operator*(&local_e8,local_120,&local_d0.plane.zaxis);
          ON_3dPoint::operator+=((ON_3dPoint *)&local_d0,&local_e8);
          ON_Plane::UpdateEquation(&local_d0.plane);
        }
        local_d0.radius = dVar2;
        local_d0.height = -local_108;
      }
      else {
        local_d0.radius = dStack_f0;
        local_d0.height = local_120;
      }
LAB_005ae455:
      if (cone != (ON_Cone *)0x0) {
        memcpy(cone,&local_d0,0x90);
      }
      bVar1 = ON_Cone::IsValid(&local_d0);
      goto LAB_005ae481;
    }
  }
  bVar1 = false;
LAB_005ae481:
  ON_Line::~ON_Line(&local_40);
  ON_Cone::~ON_Cone(&local_d0);
  return bVar1;
}

Assistant:

bool ON_RevSurface::IsConical(
      ON_Cone* cone,
      double tolerance
      ) const
{
  ON_Cone c;
  ON_Line line;
  double r[2] = {0.0,0.0};
  double h = 0.0;
  if ( !ON_IsValid(tolerance) || tolerance <= 0.0 )
    tolerance = ON_ZERO_TOLERANCE;
  if ( !ON__IsCylConeHelper(m_axis,m_curve,tolerance,c.plane,line,r,h) )
    return false;
  double dr = r[0]-r[1];
  if ( fabs(dr) <= ON_ZERO_TOLERANCE )
    return false;
  if ( 0.0 == r[0] )
  {
    c.radius = r[1];
    c.height = h;
  }
  else if ( 0.0 == r[1] )
  {
    c.plane.origin += h*c.plane.zaxis;
    c.plane.UpdateEquation();
    c.radius = r[0];
    c.height = -h;
  }
  else if ( dr > 0.0 )
  {
    h *= (r[0]/dr);
    c.plane.origin += h*c.plane.zaxis;
    c.plane.UpdateEquation();
    c.radius = r[0];
    c.height = -h;
  }
  else
  {
    double d = h*r[0]/dr;
    c.plane.origin += d*c.plane.zaxis;
    c.plane.UpdateEquation();
    c.radius = r[1];
    c.height = h-d;
  }

  if ( cone )
    *cone = c;
  return c.IsValid();
}